

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

bool __thiscall Lexer::isWord(Lexer *this,string *token,Type *type)

{
  char cVar1;
  bool bVar2;
  size_t sVar3;
  size_t marker;
  size_t local_50;
  long *local_48 [2];
  long local_38 [2];
  
  if (this->_enableWord != true) {
    return false;
  }
  local_50 = this->_cursor;
  cVar1 = (this->_text)._M_dataplus._M_p[local_50];
  if (cVar1 != '\0') {
    do {
      bVar2 = unicodeWhitespace((int)cVar1);
      sVar3 = local_50;
      if ((bVar2) ||
         ((this->_enableOperator == true &&
          (bVar2 = isSingleCharOperator((int)(this->_text)._M_dataplus._M_p[local_50]), bVar2))))
      break;
      utf8_next_char(&this->_text,&local_50);
      cVar1 = (this->_text)._M_dataplus._M_p[local_50];
      sVar3 = local_50;
    } while (cVar1 != '\0');
    if (this->_cursor < sVar3) {
      std::__cxx11::string::substr((ulong)local_48,(ulong)this);
      std::__cxx11::string::operator=((string *)token,(string *)local_48);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
      *type = word;
      this->_cursor = local_50;
      return true;
    }
  }
  return false;
}

Assistant:

bool Lexer::isWord (std::string& token, Lexer::Type& type)
{
  if (_enableWord)
  {
    std::size_t marker = _cursor;

    while (_text[marker] &&
           ! unicodeWhitespace (_text[marker]) &&
           (! _enableOperator || ! isSingleCharOperator (_text[marker])))
      utf8_next_char (_text, marker);

    if (marker > _cursor)
    {
      token = _text.substr (_cursor, marker - _cursor);
      type = Lexer::Type::word;
      _cursor = marker;
      return true;
    }
  }

  return false;
}